

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O2

sbfMwThread sbfTport_nextThread(sbfTport tport)

{
  ulong uVar1;
  uint uVar2;
  sbfMwThread psVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  sbfMwThread psVar7;
  
  pthread_mutex_lock((pthread_mutex_t *)&tport->mWeightsLock);
  uVar5 = 0xffffffff;
  psVar7 = (sbfMwThread)0x0;
  for (uVar6 = 0; uVar2 = sbfMw_getNumThreads(tport->mMw), uVar6 < uVar2; uVar6 = uVar6 + 1) {
    psVar3 = (sbfMwThread)sbfMw_getThread(tport->mMw,uVar6 & 0xffffffff);
    uVar1 = tport->mThreads;
    uVar4 = sbfMw_getThreadMask(psVar3);
    if (((uVar4 & ~uVar1) == 0) && (tport->mWeights[uVar6] < uVar5)) {
      psVar7 = psVar3;
      uVar5 = tport->mWeights[uVar6];
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&tport->mWeightsLock);
  return psVar7;
}

Assistant:

sbfMwThread
sbfTport_nextThread (sbfTport tport)
{
    sbfMwThread thread;
    sbfMwThread found;
    u_int       weight;
    u_int       i;

    sbfMutex_lock (&tport->mWeightsLock);

    found = NULL;
    weight = UINT_MAX;

    for (i = 0; i < sbfMw_getNumThreads (tport->mMw); i++)
    {
        thread = sbfMw_getThread (tport->mMw, i);
        if (~tport->mThreads & sbfMw_getThreadMask (thread))
            continue;

        if (tport->mWeights[i] < weight)
        {
            found = thread;
            weight = tport->mWeights[i];
        }
    }

    sbfMutex_unlock (&tport->mWeightsLock);
    return found;
}